

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_randomize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  int local_5c;
  int count;
  size_t p_size;
  mbedtls_mpi l;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_group *grp_local;
  
  l.p._4_4_ = 0xffffff92;
  local_5c = 0;
  sVar1 = grp->pbits;
  mbedtls_mpi_init((mbedtls_mpi *)&p_size);
  do {
    l.p._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&p_size,sVar1 + 7 >> 3,f_rng,p_rng);
    while( true ) {
      if (l.p._4_4_ != 0) goto LAB_00112d97;
      l.p._4_4_ = 0;
      iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&p_size,&grp->P);
      if (iVar2 < 0) break;
      l.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&p_size,1);
    }
    if (10 < local_5c) {
      return -0x4d00;
    }
    iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&p_size,1);
    local_5c = local_5c + 1;
  } while (iVar2 < 1);
  l.p._4_4_ = mbedtls_mpi_mul_mod(grp,&P->X,&P->X,(mbedtls_mpi *)&p_size);
  if (l.p._4_4_ == 0) {
    l.p._4_4_ = mbedtls_mpi_mul_mod(grp,&P->Z,&P->Z,(mbedtls_mpi *)&p_size);
  }
LAB_00112d97:
  mbedtls_mpi_free((mbedtls_mpi *)&p_size);
  return l.p._4_4_;
}

Assistant:

static int ecp_randomize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi l;
    size_t p_size;
    int count = 0;

#if defined(MBEDTLS_ECP_RANDOMIZE_MXZ_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_randomize_mxz( grp, P, f_rng, p_rng );
#endif /* MBEDTLS_ECP_RANDOMIZE_MXZ_ALT */

    p_size = ( grp->pbits + 7 ) / 8;
    mbedtls_mpi_init( &l );

    /* Generate l such that 1 < l < p */
    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng ) );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &P->X, &P->X, &l ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &P->Z, &P->Z, &l ) );

cleanup:
    mbedtls_mpi_free( &l );

    return( ret );
}